

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O3

void listbigfile_r(BigFile *bf,char *path)

{
  dirent *__ptr;
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *__dest;
  long lVar5;
  undefined8 uStack_e0;
  char acStack_d8 [8];
  undefined1 local_d0 [8];
  stat st;
  dirent **local_38;
  dirent **namelist;
  
  pcVar4 = bf->basename;
  uStack_e0 = 0x1024ab;
  sVar2 = strlen(pcVar4);
  uStack_e0 = 0x1024b6;
  sVar3 = strlen(path);
  lVar5 = -(sVar2 + sVar3 + 0x19 & 0xfffffffffffffff0);
  __dest = acStack_d8 + lVar5;
  if (sVar3 == 0) {
    *(undefined8 *)((long)&uStack_e0 + lVar5) = 0x1024f4;
    strcpy(__dest,pcVar4);
  }
  else {
    *(undefined8 *)((long)&uStack_e0 + lVar5) = 0x1024e7;
    sprintf(__dest,"%s/%s",pcVar4,path);
  }
  *(undefined8 *)((long)&uStack_e0 + lVar5) = 0x102506;
  stat(__dest,(stat *)local_d0);
  if (((uint)st.st_nlink & 0xf000) == 0x4000) {
    *(undefined8 *)((long)&uStack_e0 + lVar5) = 0x102535;
    uVar1 = scandir(__dest,&local_38,filter,alphasort);
    if ((int)uVar1 < 0) {
      *(undefined8 *)((long)&uStack_e0 + lVar5) = 0x102609;
      fprintf(_stderr,"cannot open dir: %s\n",__dest);
    }
    else {
      if (uVar1 != 0) {
        st.__glibc_reserved[2] = (__syscall_slong_t)uVar1;
        lVar5 = 0;
        do {
          pcVar4 = local_38[lVar5]->d_name;
          builtin_strncpy(__dest + -8,"`%\x10",4);
          __dest[-4] = '\0';
          __dest[-3] = '\0';
          __dest[-2] = '\0';
          __dest[-1] = '\0';
          sVar2 = strlen(pcVar4);
          builtin_strncpy(__dest + -8,"k%\x10",4);
          __dest[-4] = '\0';
          __dest[-3] = '\0';
          __dest[-2] = '\0';
          __dest[-1] = '\0';
          sVar3 = strlen(path);
          __dest = __dest + -(sVar3 + sVar2 + 0x19 & 0xfffffffffffffff0);
          if (sVar3 == 0) {
            __dest[-8] = -0x5a;
            __dest[-7] = '%';
            __dest[-6] = '\x10';
            __dest[-5] = '\0';
            __dest[-4] = '\0';
            __dest[-3] = '\0';
            __dest[-2] = '\0';
            __dest[-1] = '\0';
            strcpy(__dest,pcVar4);
          }
          else {
            __dest[-8] = -100;
            __dest[-7] = '%';
            __dest[-6] = '\x10';
            __dest[-5] = '\0';
            __dest[-4] = '\0';
            __dest[-3] = '\0';
            __dest[-2] = '\0';
            __dest[-1] = '\0';
            sprintf(__dest,"%s/%s",path,pcVar4);
          }
          __dest[-8] = -0x4f;
          __dest[-7] = '%';
          __dest[-6] = '\x10';
          __dest[-5] = '\0';
          __dest[-4] = '\0';
          __dest[-3] = '\0';
          __dest[-2] = '\0';
          __dest[-1] = '\0';
          listbigblock(bf,__dest);
          __dest[-8] = -0x44;
          __dest[-7] = '%';
          __dest[-6] = '\x10';
          __dest[-5] = '\0';
          __dest[-4] = '\0';
          __dest[-3] = '\0';
          __dest[-2] = '\0';
          __dest[-1] = '\0';
          listbigfile_r(bf,__dest);
          __ptr = local_38[lVar5];
          __dest[-8] = -0x37;
          __dest[-7] = '%';
          __dest[-6] = '\x10';
          __dest[-5] = '\0';
          __dest[-4] = '\0';
          __dest[-3] = '\0';
          __dest[-2] = '\0';
          __dest[-1] = '\0';
          free(__ptr);
          lVar5 = lVar5 + 1;
        } while (st.__glibc_reserved[2] != lVar5);
      }
      __dest[-8] = -0x21;
      __dest[-7] = '%';
      __dest[-6] = '\x10';
      __dest[-5] = '\0';
      __dest[-4] = '\0';
      __dest[-3] = '\0';
      __dest[-2] = '\0';
      __dest[-1] = '\0';
      free(local_38);
    }
  }
  return;
}

Assistant:

static struct
bblist * listbigfile_r(const char * basename, char * blockname, struct bblist * bblist) {
    struct dirent **namelist;
    int n;
    int i;

    char * current;
    current = _path_join(basename, blockname);

    n = scandir(current, &namelist, filter, _alphasort);
    free(current);
    if (n < 0)
        return bblist;

    for(i = 0; i < n ; i ++) {
        char * blockname1 = _path_join(blockname, namelist[i]->d_name);
        char * fullpath1 = _path_join(basename, blockname1);
        if(_big_file_path_is_block(fullpath1)) {
            struct bblist * n = malloc(sizeof(struct bblist) + strlen(blockname1) + 1);
            n->next = bblist;
            n->blockname = (char*) &n[1];
            strcpy(n->blockname, blockname1);
            bblist = n;
        } else {
            bblist = listbigfile_r(basename, blockname1, bblist);
        }
        free(fullpath1);
        free(blockname1);
        free(namelist[i]);
    }
    free(namelist);
    return bblist;
}